

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationOccurrence::~IfcAnnotationOccurrence
          (IfcAnnotationOccurrence *this)

{
  ~IfcAnnotationOccurrence
            ((IfcAnnotationOccurrence *)
             (&(this->super_IfcStyledItem).field_0x0 +
             *(long *)(*(long *)&this->super_IfcStyledItem + -0x18)));
  return;
}

Assistant:

IfcAnnotationOccurrence() : Object("IfcAnnotationOccurrence") {}